

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_movl_seg_T0(DisasContext *s,int seg_reg)

{
  TCGContext *tcg_ctx_00;
  TCGv_ptr pTVar1;
  uintptr_t o;
  TCGContext *tcg_ctx;
  TCGTemp *local_38;
  TCGv_i32 local_30;
  TCGv_i32 local_28;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if ((s->pe == 0) || (s->vm86 != 0)) {
    tcg_gen_ext16u_i64_x86_64(tcg_ctx_00,s->T0,s->T0);
    tcg_gen_op3_x86_64(tcg_ctx_00,INDEX_op_st32_i64,(TCGArg)(s->T0 + (long)tcg_ctx_00),
                       (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),
                       (ulong)(uint)seg_reg * 0x18 + 0xb8);
    tcg_gen_shli_i64_x86_64(tcg_ctx_00,tcg_ctx_00->cpu_seg_base[(uint)seg_reg],s->T0,4);
    if (seg_reg != 2) {
      return;
    }
  }
  else {
    tcg_gen_extrl_i64_i32_x86_64(tcg_ctx_00,s->tmp2_i32,s->T0);
    pTVar1 = tcg_ctx_00->cpu_env;
    local_30 = tcg_const_i32_x86_64(tcg_ctx_00,seg_reg);
    local_28 = s->tmp2_i32 + (long)tcg_ctx_00;
    local_30 = local_30 + (long)tcg_ctx_00;
    local_38 = (TCGTemp *)(pTVar1 + (long)tcg_ctx_00);
    tcg_gen_callN_x86_64(tcg_ctx_00,helper_load_seg_x86_64,(TCGTemp *)0x0,3,&local_38);
    if (seg_reg != 2) {
      if (3 < seg_reg) {
        return;
      }
      if (s->code32 == 0) {
        return;
      }
    }
  }
  (s->base).is_jmp = DISAS_TOO_MANY;
  return;
}

Assistant:

static void gen_movl_seg_T0(DisasContext *s, int seg_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    if (s->pe && !s->vm86) {
        tcg_gen_trunc_tl_i32(tcg_ctx, s->tmp2_i32, s->T0);
        gen_helper_load_seg(tcg_ctx, tcg_ctx->cpu_env, tcg_const_i32(tcg_ctx, seg_reg), s->tmp2_i32);
        /* abort translation because the addseg value may change or
           because ss32 may change. For R_SS, translation must always
           stop as a special handling must be done to disable hardware
           interrupts for the next instruction */
        if (seg_reg == R_SS || (s->code32 && seg_reg < R_FS)) {
            s->base.is_jmp = DISAS_TOO_MANY;
        }
    } else {
        gen_op_movl_seg_T0_vm(s, seg_reg);
        if (seg_reg == R_SS) {
            s->base.is_jmp = DISAS_TOO_MANY;
        }
    }
}